

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# signalhandler.cc
# Opt level: O0

void google::anon_unknown_0::DumpSignalInfo(int signal_number,siginfo_t *siginfo)

{
  undefined *puVar1;
  __pid_t _Var2;
  void *this;
  basic_ostream<char,_std::char_traits<char>_> *__out;
  char *str;
  size_t sVar3;
  string local_310 [32];
  native_handle_type local_2f0;
  ostringstream local_2d8 [8];
  ostringstream oss;
  undefined1 local_160 [8];
  MinimalFormatter formatter;
  char buf [256];
  anon_struct_16_2_a352b0bb kFailureSignal;
  anon_struct_16_2_a352b0bb *__end2;
  anon_struct_16_2_a352b0bb *__begin2;
  anon_struct_16_2_a352b0bb (*__range2) [6];
  char *signal_name;
  siginfo_t *siginfo_local;
  int signal_number_local;
  
  __range2 = (anon_struct_16_2_a352b0bb (*) [6])0x0;
  for (__end2 = (anon_struct_16_2_a352b0bb *)&(anonymous_namespace)::kFailureSignals;
      (Elf64_Dyn *)__end2 != _DYNAMIC; __end2 = __end2 + 1) {
    buf._248_4_ = (undefined4)*(undefined8 *)__end2;
    if (signal_number == buf._248_4_) {
      __range2 = (anon_struct_16_2_a352b0bb (*) [6])__end2->name;
    }
  }
  MinimalFormatter::MinimalFormatter((MinimalFormatter *)local_160,(char *)&formatter.end_,0x100);
  MinimalFormatter::AppendString((MinimalFormatter *)local_160,"*** ");
  if (__range2 == (anon_struct_16_2_a352b0bb (*) [6])0x0) {
    MinimalFormatter::AppendString((MinimalFormatter *)local_160,"Signal ");
    MinimalFormatter::AppendUint64((MinimalFormatter *)local_160,(long)signal_number,10);
  }
  else {
    MinimalFormatter::AppendString((MinimalFormatter *)local_160,(char *)__range2);
  }
  MinimalFormatter::AppendString((MinimalFormatter *)local_160," (@0x");
  MinimalFormatter::AppendUint64
            ((MinimalFormatter *)local_160,(siginfo->_sifields)._sigpoll.si_band,0x10);
  MinimalFormatter::AppendString((MinimalFormatter *)local_160,")");
  MinimalFormatter::AppendString((MinimalFormatter *)local_160," received by PID ");
  _Var2 = getpid();
  MinimalFormatter::AppendUint64((MinimalFormatter *)local_160,(long)_Var2,10);
  MinimalFormatter::AppendString((MinimalFormatter *)local_160," (TID ");
  std::__cxx11::ostringstream::ostringstream(local_2d8);
  this = (void *)std::ostream::operator<<(local_2d8,std::showbase);
  __out = (basic_ostream<char,_std::char_traits<char>_> *)std::ostream::operator<<(this,std::hex);
  local_2f0 = (native_handle_type)std::this_thread::get_id();
  std::operator<<(__out,(id)local_2f0);
  std::__cxx11::ostringstream::str();
  str = (char *)std::__cxx11::string::c_str();
  MinimalFormatter::AppendString((MinimalFormatter *)local_160,str);
  std::__cxx11::string::~string(local_310);
  MinimalFormatter::AppendString((MinimalFormatter *)local_160,") ");
  MinimalFormatter::AppendString((MinimalFormatter *)local_160,"from PID ");
  MinimalFormatter::AppendUint64
            ((MinimalFormatter *)local_160,(long)(siginfo->_sifields)._pad[0],10);
  MinimalFormatter::AppendString((MinimalFormatter *)local_160,"; ");
  MinimalFormatter::AppendString((MinimalFormatter *)local_160,"stack trace: ***\n");
  puVar1 = (anonymous_namespace)::g_failure_writer;
  sVar3 = MinimalFormatter::num_bytes_written((MinimalFormatter *)local_160);
  (*(code *)puVar1)(&formatter.end_,sVar3);
  std::__cxx11::ostringstream::~ostringstream(local_2d8);
  return;
}

Assistant:

void DumpSignalInfo(int signal_number, siginfo_t* siginfo) {
  // Get the signal name.
  const char* signal_name = nullptr;
  for (auto kFailureSignal : kFailureSignals) {
    if (signal_number == kFailureSignal.number) {
      signal_name = kFailureSignal.name;
    }
  }

  char buf[256];  // Big enough for signal info.
  MinimalFormatter formatter(buf, sizeof(buf));

  formatter.AppendString("*** ");
  if (signal_name) {
    formatter.AppendString(signal_name);
  } else {
    // Use the signal number if the name is unknown.  The signal name
    // should be known, but just in case.
    formatter.AppendString("Signal ");
    formatter.AppendUint64(static_cast<uint64>(signal_number), 10);
  }
  formatter.AppendString(" (@0x");
  formatter.AppendUint64(reinterpret_cast<uintptr_t>(siginfo->si_addr), 16);
  formatter.AppendString(")");
  formatter.AppendString(" received by PID ");
  formatter.AppendUint64(static_cast<uint64>(getpid()), 10);
  formatter.AppendString(" (TID ");

  std::ostringstream oss;
  oss << std::showbase << std::hex << std::this_thread::get_id();
  formatter.AppendString(oss.str().c_str());

  formatter.AppendString(") ");
  // Only linux has the PID of the signal sender in si_pid.
#  ifdef GLOG_OS_LINUX
  formatter.AppendString("from PID ");
  formatter.AppendUint64(static_cast<uint64>(siginfo->si_pid), 10);
  formatter.AppendString("; ");
#  endif
  formatter.AppendString("stack trace: ***\n");
  g_failure_writer(buf, formatter.num_bytes_written());
}